

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

UChar * toUpperCase(UChar *source,int32_t len,char *locale)

{
  uint in_EAX;
  int32_t destCapacity;
  int32_t iVar1;
  UChar *dest;
  UErrorCode ec;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  destCapacity = u_strToUpper_63((UChar *)0x0,0,source,len,locale,
                                 (UErrorCode *)((long)&uStack_38 + 4));
  uStack_38 = uStack_38 & 0xffffffff;
  iVar1 = len;
  if (len < destCapacity) {
    iVar1 = destCapacity;
  }
  dest = (UChar *)uprv_malloc_63((long)iVar1 * 2);
  u_strToUpper_63(dest,destCapacity,source,len,locale,(UErrorCode *)((long)&uStack_38 + 4));
  if (0 < uStack_38._4_4_) {
    u_memcpy_63(dest,source,len);
  }
  return dest;
}

Assistant:

static UChar* 
toUpperCase(const UChar* source, int32_t len, const char* locale) {
    UChar* dest = NULL;
    UErrorCode ec = U_ZERO_ERROR;
    int32_t destLen = u_strToUpper(dest, 0, source, len, locale, &ec);

    ec = U_ZERO_ERROR;
    dest = (UChar*)uprv_malloc(sizeof(UChar) * MAX(destLen, len));
    u_strToUpper(dest, destLen, source, len, locale, &ec);
    if (U_FAILURE(ec)) {
        u_memcpy(dest, source, len);
    } 
    return dest;
}